

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O0

void calc_proj_params_r1_high_bd_sse4_1
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt1,int flt1_stride,int64_t (*H) [2],int64_t *C)

{
  undefined8 *puVar1;
  ulong uVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  int in_ECX;
  int iVar18;
  ulong in_RDX;
  longlong extraout_RDX;
  longlong in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  uint uVar21;
  uint uVar22;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  __m128i v;
  __m128i v_00;
  long in_stack_00000008;
  __m128i h1x;
  __m128i c;
  __m128i c1_val;
  __m128i h11_val;
  __m128i c1_odd;
  __m128i c1_even;
  __m128i h11_odd;
  __m128i h11_even;
  __m128i s;
  __m128i d;
  __m128i f2;
  __m128i s_load;
  __m128i u_load;
  int j;
  int i;
  __m128i zero;
  __m128i c1;
  __m128i h11;
  uint16_t *dat;
  uint16_t *src;
  int size;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  int local_370;
  int local_36c;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  
  iVar18 = (int)in_RDX;
  iVar17 = (int)in_RSI * iVar18;
  for (local_36c = 0; local_36c < iVar18; local_36c = local_36c + 1) {
    for (local_370 = 0; local_370 < (int)in_RSI; local_370 = local_370 + 4) {
      uVar2 = *(ulong *)(in_R8 * 2 + (long)(local_36c * in_R9D) * 2 + (long)local_370 * 2);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar2;
      auVar19 = pmovzxwd(auVar8,uVar2);
      uVar2 = *(ulong *)(in_RDI * 2 + (long)(local_36c * in_ECX) * 2 + (long)local_370 * 2);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar2;
      auVar20 = pmovzxwd(auVar7,uVar2);
      in_RDX = (ulong)(uint)h1x[0];
      puVar1 = (undefined8 *)
               (in_stack_00000008 + (long)(int)(local_36c * (uint)h1x[0]) * 4 + (long)local_370 * 4)
      ;
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      local_158 = auVar19._0_4_;
      iStack_154 = auVar19._4_4_;
      iStack_150 = auVar19._8_4_;
      iStack_14c = auVar19._12_4_;
      local_178 = auVar20._0_4_;
      iStack_174 = auVar20._4_4_;
      iStack_170 = auVar20._8_4_;
      iStack_16c = auVar20._12_4_;
      uVar21 = iStack_174 - iStack_154;
      iStack_16c = iStack_16c - iStack_14c;
      local_1f8 = (int)uVar5;
      iStack_1f4 = (int)((ulong)uVar5 >> 0x20);
      iStack_1f0 = (int)uVar6;
      iStack_1ec = (int)((ulong)uVar6 >> 0x20);
      uVar22 = iStack_1f4 - iStack_154;
      iStack_1ec = iStack_1ec - iStack_14c;
      local_3a8 = CONCAT44(uVar22,local_1f8 + local_158 * -0x10);
      uStack_3a0 = CONCAT44(iStack_1ec,iStack_1f0 - iStack_150);
      auVar16._8_8_ = uStack_3a0;
      auVar16._0_8_ = local_3a8;
      auVar15._8_8_ = uStack_3a0;
      auVar15._0_8_ = local_3a8;
      pmuldq(auVar16,auVar15);
      auVar14._4_4_ = 0;
      auVar14._0_4_ = uVar22;
      auVar13._4_4_ = 0;
      auVar13._0_4_ = uVar22;
      auVar14._8_4_ = iStack_1ec;
      auVar14._12_4_ = 0;
      auVar13._8_4_ = iStack_1ec;
      auVar13._12_4_ = 0;
      pmuldq(auVar14,auVar13);
      auVar11._4_4_ = uVar21;
      auVar11._0_4_ = local_178 * 0x10 + local_158 * -0x10;
      auVar11._12_4_ = iStack_16c;
      auVar11._8_4_ = iStack_170 - iStack_150;
      auVar12._8_8_ = uStack_3a0;
      auVar12._0_8_ = local_3a8;
      pmuldq(auVar12,auVar11);
      auVar10._4_4_ = 0;
      auVar10._0_4_ = uVar22;
      auVar9._4_4_ = 0;
      auVar9._0_4_ = uVar21;
      auVar10._8_4_ = iStack_1ec;
      auVar10._12_4_ = 0;
      auVar9._8_4_ = iStack_16c;
      auVar9._12_4_ = 0;
      auVar3._4_8_ = 0;
      auVar3._0_4_ = (int)uVar22 >> 0x1f;
      auVar19._12_4_ = iStack_1ec >> 0x1f;
      auVar19._0_12_ = auVar3 << 0x20;
      pblendw(auVar10,auVar19,0xcc);
      auVar4._4_8_ = 0;
      auVar4._0_4_ = (int)uVar21 >> 0x1f;
      auVar20._12_4_ = iStack_16c >> 0x1f;
      auVar20._0_12_ = auVar4 << 0x20;
      pblendw(auVar9,auVar20,0xcc);
      pmuldq(auVar10,auVar9);
    }
  }
  v[1] = in_RDX;
  v[0] = in_RSI;
  xx_storeu_128((void *)c[0],v);
  v_00[1] = extraout_RDX;
  v_00[0] = in_RSI;
  xx_storeu_128((void *)(h1x[1] + 0x10),v_00);
  *(long *)(h1x[1] + 0x18) = *(long *)(h1x[1] + 0x18) / (long)iVar17;
  *(long *)(c[0] + 8) = *(long *)(c[0] + 8) / (long)iVar17;
  return;
}

Assistant:

static inline void calc_proj_params_r1_high_bd_sse4_1(
    const uint8_t *src8, int width, int height, int src_stride,
    const uint8_t *dat8, int dat_stride, int32_t *flt1, int flt1_stride,
    int64_t H[2][2], int64_t C[2]) {
  const int size = width * height;
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *dat = CONVERT_TO_SHORTPTR(dat8);
  __m128i h11, c1;
  const __m128i zero = _mm_setzero_si128();
  c1 = h11 = zero;

  for (int i = 0; i < height; ++i) {
    for (int j = 0; j < width; j += 4) {
      const __m128i u_load = _mm_cvtepu16_epi32(
          _mm_loadl_epi64((__m128i *)(dat + i * dat_stride + j)));
      const __m128i s_load = _mm_cvtepu16_epi32(
          _mm_loadl_epi64((__m128i *)(src + i * src_stride + j)));
      __m128i f2 = _mm_loadu_si128((__m128i *)(flt1 + i * flt1_stride + j));
      __m128i d = _mm_slli_epi32(u_load, SGRPROJ_RST_BITS);
      __m128i s = _mm_slli_epi32(s_load, SGRPROJ_RST_BITS);
      s = _mm_sub_epi32(s, d);
      f2 = _mm_sub_epi32(f2, d);

      const __m128i h11_even = _mm_mul_epi32(f2, f2);
      const __m128i h11_odd =
          _mm_mul_epi32(_mm_srli_epi64(f2, 32), _mm_srli_epi64(f2, 32));
      h11 = _mm_add_epi64(h11, h11_even);
      h11 = _mm_add_epi64(h11, h11_odd);

      const __m128i c1_even = _mm_mul_epi32(f2, s);
      const __m128i c1_odd =
          _mm_mul_epi32(_mm_srli_epi64(f2, 32), _mm_srli_epi64(s, 32));
      c1 = _mm_add_epi64(c1, c1_even);
      c1 = _mm_add_epi64(c1, c1_odd);
    }
  }

  const __m128i h11_val = _mm_add_epi64(h11, _mm_srli_si128(h11, 8));

  const __m128i c1_val = _mm_add_epi64(c1, _mm_srli_si128(c1, 8));

  const __m128i c = _mm_unpacklo_epi64(zero, c1_val);
  const __m128i h1x = _mm_unpacklo_epi64(zero, h11_val);

  xx_storeu_128(C, c);
  xx_storeu_128(H[1], h1x);

  H[1][1] /= size;
  C[1] /= size;
}